

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::Pointer::IsSameImpl(Pointer *this,Type *that,IsSameCache *seen)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<std::_Rb_tree_iterator<std::pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*>_>,_bool>
  pVar4;
  pair<const_spvtools::opt::analysis::Pointer_*,_const_spvtools::opt::analysis::Pointer_*> local_40;
  long lVar3;
  
  iVar2 = (*that->_vptr_Type[0x22])(that);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if ((lVar3 != 0) && (this->storage_class_ == *(StorageClass *)(lVar3 + 0x30))) {
    iVar2 = (*that->_vptr_Type[0x22])(that);
    local_40.second = (Pointer *)CONCAT44(extraout_var_00,iVar2);
    local_40.first = this;
    pVar4 = std::
            _Rb_tree<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::_Identity<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::less<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::allocator<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>>
            ::
            _M_insert_unique<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>
                      ((_Rb_tree<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::_Identity<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::less<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::allocator<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>>
                        *)seen,&local_40);
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return true;
    }
    iVar2 = (*this->pointee_type_->_vptr_Type[2])
                      (this->pointee_type_,*(undefined8 *)(lVar3 + 0x28),seen);
    std::
    _Rb_tree<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::_Identity<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::less<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::allocator<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>,std::_Identity<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::less<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>,std::allocator<std::pair<spvtools::opt::analysis::Pointer_const*,spvtools::opt::analysis::Pointer_const*>>>
                        *)seen,(_Base_ptr)pVar4.first._M_node);
    if ((char)iVar2 != '\0') {
      bVar1 = analysis::Type::HasSameDecorations(&this->super_Type,that);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Pointer::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Pointer* pt = that->AsPointer();
  if (!pt) return false;
  if (storage_class_ != pt->storage_class_) return false;
  auto p = seen->insert(std::make_pair(this, that->AsPointer()));
  if (!p.second) {
    return true;
  }
  bool same_pointee = pointee_type_->IsSameImpl(pt->pointee_type_, seen);
  seen->erase(p.first);
  if (!same_pointee) {
    return false;
  }
  return HasSameDecorations(that);
}